

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

short * __thiscall
kj::_::NullableValue<short>::emplace<long_long>(NullableValue<short> *this,longlong *params)

{
  longlong *params_00;
  longlong *params_local;
  NullableValue<short> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<short>(&(this->field_1).value);
  }
  params_00 = fwd<long_long>(params);
  ctor<short,long_long>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (short *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }